

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForNotEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  int32 iVar6;
  int32 iVar7;
  undefined4 *puVar8;
  ValueInfo *valueInfo_00;
  IntBounds *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar9;
  IntBoundedValueInfo *pIVar10;
  bool local_6d;
  int32 local_60;
  int32 local_5c;
  int32 newMax;
  int32 newMin;
  int32 constantBound;
  IntBounds *bounds;
  ValueInfo *valueInfo;
  bool isExplicit_local;
  IntConstantBounds *boundConstantBounds_local;
  Value *boundValue_local;
  IntConstantBounds *constantBounds_local;
  Value *value_local;
  GlobOpt *this_local;
  
  if ((value == (Value *)0x0) && (bVar2 = IntConstantBounds::IsConstant(constantBounds), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x1d1,"(value || constantBounds.IsConstant())",
                       "value || constantBounds.IsConstant()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((boundValue == (Value *)0x0) &&
     (bVar2 = IntConstantBounds::IsConstant(boundConstantBounds), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x1d2,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (value == (Value *)0x0) {
    return (ValueInfo *)0x0;
  }
  if (boundValue != (Value *)0x0) {
    VVar4 = ::Value::GetValueNumber(value);
    VVar5 = ::Value::GetValueNumber(boundValue);
    if (VVar4 == VVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x1d7,
                         "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())",
                         "!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  valueInfo_00 = ::Value::GetValueInfo(value);
  bVar2 = IntConstantBounds::IsConstant(boundConstantBounds);
  bVar3 = IntConstantBounds::IsConstant(boundConstantBounds);
  local_6d = false;
  if (bVar3) {
    iVar7 = IntConstantBounds::LowerBound(boundConstantBounds);
    iVar6 = IntConstantBounds::UpperBound(constantBounds);
    local_6d = iVar7 == iVar6;
  }
  this_00 = GetIntBoundsToUpdate(this,valueInfo_00,constantBounds,false,bVar2,local_6d,isExplicit);
  if (this_00 == (IntBounds *)0x0) {
LAB_0060cb0c:
    bVar2 = ValueType::IsInt(&valueInfo_00->super_ValueType);
    if ((bVar2) && (bVar2 = IntConstantBounds::IsConstant(boundConstantBounds), bVar2)) {
      iVar7 = IntConstantBounds::LowerBound(boundConstantBounds);
      local_5c = IntConstantBounds::LowerBound(constantBounds);
      local_60 = IntConstantBounds::UpperBound(constantBounds);
      if (iVar7 == local_5c) {
        if (local_60 < local_5c) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x1ff,"(newMin <= newMax)","newMin <= newMax");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_5c == local_60) {
          return (ValueInfo *)0x0;
        }
        local_5c = local_5c + 1;
      }
      else {
        if (iVar7 != local_60) {
          return (ValueInfo *)0x0;
        }
        if (local_60 < local_5c) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x208,"(newMin <= newMax)","newMin <= newMax");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (local_5c == local_60) {
          return (ValueInfo *)0x0;
        }
        local_60 = local_60 + -1;
      }
      this_local = (GlobOpt *)NewIntRangeValueInfo(this,valueInfo_00,local_5c,local_60);
    }
    else {
      this_local = (GlobOpt *)0x0;
    }
  }
  else {
    if (boundValue == (Value *)0x0) {
      iVar7 = IntConstantBounds::LowerBound(boundConstantBounds);
      bVar2 = IntBounds::SetIsNot(this_00,iVar7,isExplicit);
      if (bVar2) goto LAB_0060caa0;
    }
    else {
      bVar2 = IntBounds::SetIsNot(this_00,boundValue,isExplicit);
      if (bVar2) {
LAB_0060caa0:
        paVar9 = &ValueInfo::Type(valueInfo_00)->field_0;
        bVar2 = IntBounds::RequiresIntBoundedValueInfo
                          (this_00,(ValueType)
                                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar9->field_0);
        if (bVar2) {
          pIVar10 = NewIntBoundedValueInfo(this,valueInfo_00,this_00);
          return &pIVar10->super_ValueInfo;
        }
        IntBounds::Delete(this_00);
        goto LAB_0060cb0c;
      }
    }
    IntBounds::Delete(this_00);
    this_local = (GlobOpt *)0x0;
  }
  return (ValueInfo *)this_local;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForNotEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(
            valueInfo,
            constantBounds,
            false,
            boundConstantBounds.IsConstant(),
            boundConstantBounds.IsConstant() && boundConstantBounds.LowerBound() == constantBounds.UpperBound(),
            isExplicit);
    if(bounds)
    {
        if(boundValue
                ? bounds->SetIsNot(boundValue, isExplicit)
                : bounds->SetIsNot(boundConstantBounds.LowerBound(), isExplicit))
        {
            if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
            {
                return NewIntBoundedValueInfo(valueInfo, bounds);
            }
        }
        else
        {
            bounds->Delete();
            return nullptr;
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt() || !boundConstantBounds.IsConstant())
    {
        return nullptr;
    }
    const int32 constantBound = boundConstantBounds.LowerBound();

    // The value is not equal to a constant, so narrow the range if the constant is equal to the value's lower or upper bound
    int32 newMin = constantBounds.LowerBound(), newMax = constantBounds.UpperBound();
    if(constantBound == newMin)
    {
        Assert(newMin <= newMax);
        if(newMin == newMax)
        {
            return nullptr;
        }
        ++newMin;
    }
    else if(constantBound == newMax)
    {
        Assert(newMin <= newMax);
        if(newMin == newMax)
        {
            return nullptr;
        }
        --newMax;
    }
    else
    {
        return nullptr;
    }
    return NewIntRangeValueInfo(valueInfo, newMin, newMax);
}